

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

char * my_stristr(char *string,char *pattern)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  __int32_t *p_Var4;
  long lVar5;
  __int32_t **pp_Var6;
  long lVar7;
  bool bVar8;
  
  if (*string != '\0') {
    while( true ) {
      bVar2 = *string;
      bVar8 = (ulong)bVar2 == 0;
      if (bVar8) break;
      pp_Var6 = __ctype_toupper_loc();
      p_Var4 = *pp_Var6;
      iVar3 = p_Var4[bVar2];
      while (iVar3 != p_Var4[(byte)*pattern]) {
        pbVar1 = (byte *)string + 1;
        bVar8 = (ulong)*pbVar1 == 0;
        if (bVar8) {
          return (char *)0x0;
        }
        string = (char *)((byte *)string + 1);
        iVar3 = p_Var4[*pbVar1];
      }
      if (bVar8) {
        return (char *)0x0;
      }
      pp_Var6 = __ctype_toupper_loc();
      lVar7 = 0;
      while ((*pp_Var6)[((byte *)string)[lVar7]] == (*pp_Var6)[(byte)pattern[lVar7]]) {
        lVar5 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        if (pattern[lVar5] == '\0') {
          return (char *)(byte *)string;
        }
      }
      pbVar1 = (byte *)string + 1;
      string = (char *)((byte *)string + 1);
      if (*pbVar1 == 0) {
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *my_stristr(const char *string, const char *pattern)
{
	const char *pptr, *sptr;
	char *start;

	for (start = (char *)string; *start != 0; start++) {
		/* Find start of pattern in string */
		for ( ; ((*start != 0) && (toupper((unsigned char)*start) != toupper((unsigned char)*pattern))); start++)
			;
		if (*start == 0)
			return NULL;

		pptr = (const char *)pattern;
		sptr = (const char *)start;

		while (toupper((unsigned char)*sptr) == toupper((unsigned char)*pptr)) {
			sptr++;
			pptr++;

			/* If end of pattern then pattern was found */
			if (*pptr == 0)
				return (start);
		}
	}

	return NULL;
}